

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::Remove(CopyRemovePolicy<JsUtil::List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
         *this,List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *list,TElementType *item)

{
  int iVar1;
  Type ppPVar2;
  long lVar3;
  long lVar4;
  
  iVar1 = (list->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count;
  lVar3 = (long)iVar1;
  if (0 < lVar3) {
    ppPVar2 = (list->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
              buffer;
    lVar4 = 0;
    do {
      if (ppPVar2[lVar4] == *item) {
        if ((int)lVar4 + 1 < iVar1) {
          do {
            ppPVar2[(int)lVar4] = ppPVar2[lVar4 + 1];
            lVar4 = lVar4 + 1;
          } while (iVar1 + -1 != (int)lVar4);
        }
        (list->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count =
             iVar1 + -1;
        ppPVar2[lVar3 + -1] = (Probe *)0x0;
        return;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  return;
}

Assistant:

void Remove(TListType* list, const TElementType& item)
        {
            TElementType* buffer = list->buffer;
            int& count = list->count;

            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(buffer[i], item))
                {
                    for (int j = i + 1; j < count; i++, j++)
                    {
                        buffer[i] = buffer[j];
                    }
                    count--;

                    if (clearOldEntries)
                    {
                        ClearArray(buffer + count, 1);
                    }
                    break;
                }
            }
        }